

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_update_picked_ref_frames_mask
               (MACROBLOCK *x,int ref_type,BLOCK_SIZE bsize,int mib_size,int mi_row,int mi_col)

{
  long lVar1;
  byte bVar2;
  int *piVar3;
  undefined7 in_register_00000011;
  long lVar4;
  long lVar5;
  long lVar6;
  
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [CONCAT71(in_register_00000011,bsize) & 0xffffffff];
  lVar4 = (long)(int)(mi_row & mib_size - 1U);
  lVar1 = lVar4 + (ulong)bVar2;
  lVar6 = (long)(int)(mib_size - 1U & mi_col);
  piVar3 = x->picked_ref_frames_mask + lVar4 * 0x20;
  lVar5 = lVar6;
  do {
    do {
      piVar3[lVar5] = piVar3[lVar5] | 1 << ((byte)ref_type & 0x1f);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (long)((ulong)bVar2 + lVar6));
    lVar4 = lVar4 + 1;
    piVar3 = piVar3 + 0x20;
    lVar5 = lVar6;
  } while (lVar4 < lVar1);
  return;
}

Assistant:

void av1_update_picked_ref_frames_mask(MACROBLOCK *const x, int ref_type,
                                       BLOCK_SIZE bsize, int mib_size,
                                       int mi_row, int mi_col) {
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  const int sb_size_mask = mib_size - 1;
  const int mi_row_in_sb = mi_row & sb_size_mask;
  const int mi_col_in_sb = mi_col & sb_size_mask;
  const int mi_size = mi_size_wide[bsize];
  for (int i = mi_row_in_sb; i < mi_row_in_sb + mi_size; ++i) {
    for (int j = mi_col_in_sb; j < mi_col_in_sb + mi_size; ++j) {
      x->picked_ref_frames_mask[i * 32 + j] |= 1 << ref_type;
    }
  }
}